

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitT(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *__src;
  float *__src_00;
  int iVar5;
  
  iVar1 = this->v;
  iVar2 = this->vw;
  iVar5 = (-1 << ((this->res).vlog2 & 0x1fU)) + iVar2 + iVar1;
  iVar3 = this->u;
  iVar4 = this->uw;
  __src = this->ku;
  __src_00 = this->kv;
  if (iVar5 < iVar2) {
    k->res = this->res;
    k->u = iVar3;
    k->v = 0;
    k->uw = iVar4;
    k->vw = iVar5;
    memcpy(k->kubuff,__src,(long)iVar4 << 2);
    memcpy(k->kvbuff,__src_00 + ((long)iVar2 - (long)iVar5),(long)iVar5 * 4);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = 0;
    iVar5 = this->vw - iVar5;
  }
  else {
    iVar5 = this->rot;
    k->res = this->res;
    k->u = iVar3;
    k->v = iVar1;
    k->uw = iVar4;
    k->vw = iVar2;
    memcpy(k->kubuff,__src,(long)iVar4 << 2);
    memcpy(k->kvbuff,__src_00,(long)iVar2 << 2);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = iVar5;
    k->v = (-1 << ((this->res).vlog2 & 0x1fU)) + iVar1;
    this->v = 0;
    iVar5 = 0;
  }
  this->vw = iVar5;
  return;
}

Assistant:

void splitT(PtexSeparableKernel& k)
    {
        // split off top piece of width w into k
        int w = v + vw - res.v();
        if (w < vw) {
            // normal case - split off a portion
            //    res  u  v  uw vw  ku  kv
            k.set(res, u, 0, uw, w, ku, kv + vw - w);

            // update local
            vw -= w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.v -= res.v();
            v = 0; vw = 0;
        }
    }